

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O3

void gimage::getPrefixAlternatives
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *list,string *depthname,char *spath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pbVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  long *plVar8;
  size_type *psVar9;
  ulong uVar10;
  char cVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ulong local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar5 = std::__cxx11::string::find_last_of((char *)depthname,0x1630cc,0xffffffffffffffff);
  cVar11 = (char)depthname;
  uVar6 = std::__cxx11::string::rfind(cVar11,0x3a);
  if (uVar6 != 0xffffffffffffffff) {
    iVar4 = std::__cxx11::string::compare((ulong)depthname,uVar6,(char *)0x2);
    if (iVar4 != 0) {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)depthname);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,&local_b0
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
  }
  uVar10 = lVar5 + 1;
  uVar6 = std::__cxx11::string::rfind(cVar11,0x2e);
  local_90 = uVar10;
  if (uVar10 < uVar6 && uVar6 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)depthname);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  uVar6 = std::__cxx11::string::rfind(cVar11,0x5f);
  if (local_90 < uVar6 && uVar6 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)depthname);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,&local_b0
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      uVar6 = std::__cxx11::string::rfind(cVar11,0x5f);
    } while ((uVar6 != 0xffffffffffffffff) && (local_90 < uVar6));
  }
  if ((spath != (char *)0x0) && (*spath != '\0')) {
    pbVar2 = (list->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (list->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    sVar7 = strlen(spath);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,spath,spath + sVar7);
    gutil::split(&local_88,&local_b0,':',true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_60 = (ulong)((long)pbVar2 - (long)pbVar3) >> 5;
      local_68 = (ulong)((uint)local_60 & 0x7fffffff);
      uVar6 = 0;
      do {
        local_58 = uVar6;
        if (local_88.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p
            [local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_string_length - 1] != '/') {
          std::__cxx11::string::push_back
                    ((char)local_88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (char)uVar6 * ' ');
        }
        if (0 < (int)local_60) {
          lVar5 = 0;
          uVar10 = local_68;
          do {
            pbVar2 = local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::substr
                      ((ulong)local_50,
                       (long)&(((list->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar5);
            plVar8 = (long *)std::__cxx11::string::replace
                                       ((ulong)local_50,0,(char *)0x0,
                                        (ulong)pbVar2[uVar6]._M_dataplus._M_p);
            psVar9 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_b0.field_2._M_allocated_capacity = *psVar9;
              local_b0.field_2._8_8_ = plVar8[3];
              local_b0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar9;
              local_b0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_b0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,
                       &local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != paVar1) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
            lVar5 = lVar5 + 0x20;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        uVar6 = local_58 + 1;
      } while (uVar6 < (ulong)((long)local_88.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_88.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
  }
  return;
}

Assistant:

void getPrefixAlternatives(std::vector<std::string> &list, const std::string &depthname,
                           const char *spath)
{
  // determine possible prefixes

  size_t spos, pos;

  spos=depthname.find_last_of("/\\");

  if (spos == depthname.npos)
  {
    spos=0;
  }
  else
  {
    spos++;
  }

  pos=depthname.rfind(':');

  if (pos != depthname.npos && depthname.compare(pos, 2, ":\\") != 0)
  {
    list.push_back(depthname.substr(0, pos));
  }

  pos=depthname.rfind('.');

  if (pos != depthname.npos && pos > spos)
  {
    list.push_back(depthname.substr(0, pos));
  }

  pos=depthname.rfind('_', pos-1);

  while (pos != depthname.npos && pos > spos)
  {
    list.push_back(depthname.substr(0, pos));
    pos=depthname.rfind('_', pos-1);
  }

  int n=static_cast<int>(list.size());

  // combine possible prefixes with all directories of the optional search
  // path

  if (spath != 0 && spath[0] != '\0')
  {
    std::vector<std::string> dir;

#ifdef WIN32
    gutil::split(dir, spath, ';');
#else
    gutil::split(dir, spath, ':');
#endif

    for (size_t i=0; i<dir.size(); i++)
    {
#ifdef WIN32

      if (dir[i][dir[i].size()-1] != '\\')
      {
        dir[i].push_back('\\');
      }

#else

      if (dir[i][dir[i].size()-1] != '/')
      {
        dir[i].push_back('/');
      }

#endif

      for (int k=0; k<n; k++)
      {
        list.push_back(dir[i]+list[k].substr(spos));
      }
    }
  }
}